

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O1

vec3 __thiscall ltc::sample(ltc *this,vec3 *view_dir,vec2 *random_parameters)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  vec3 vVar6;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  
  fVar1 = (random_parameters->field_0).field_0.x;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar2 = acosf(fVar1);
  fVar1 = (random_parameters->field_0).field_0.y * 6.2831855;
  fVar3 = sinf(fVar2);
  fVar4 = cosf(fVar1);
  fVar4 = fVar4 * fVar3;
  fVar3 = sinf(fVar2);
  fVar1 = sinf(fVar1);
  fVar1 = fVar1 * fVar3;
  fVar2 = cosf(fVar2);
  get_framed_ltc_matrix(this);
  fVar3 = local_1c * fVar2 + local_34 * fVar4 + local_28 * fVar1;
  fVar5 = local_18 * fVar2 + local_30 * fVar4 + local_24 * fVar1;
  fVar2 = fVar2 * local_14 + fVar4 * local_2c + fVar1 * local_20;
  fVar1 = fVar2 * fVar2 + fVar5 * fVar5 + fVar3 * fVar3;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar1 = 1.0 / fVar1;
  vVar6.field_0._8_4_ = fVar1 * fVar2;
  vVar6.field_0.field_0.y = fVar5 * fVar1;
  vVar6.field_0.field_0.x = fVar3 * fVar1;
  return (vec3)vVar6.field_0;
}

Assistant:

glm::vec3 ltc::sample(const glm::vec3 &view_dir, const glm::vec2 &random_parameters) const
{
  const float phi = std::acos(std::sqrt(random_parameters.x));
  const float theta = 2.0f * pi * random_parameters.y;

  const glm::vec3 original_sample{
    std::sin(phi) * std::cos(theta),
    std::sin(phi) * std::sin(theta),
    std::cos(phi)
  };

  return glm::normalize(get_framed_ltc_matrix() * original_sample);
}